

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_rep(lua_State *L)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *__src;
  lua_Integer lVar3;
  char *__src_00;
  char *local_2070;
  char *p;
  luaL_Buffer b;
  size_t totallen;
  char *sep;
  int n;
  char *s;
  size_t lsep;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  __src = luaL_checklstring(L,1,&lsep);
  lVar3 = luaL_checkinteger((lua_State *)l,2);
  sep._4_4_ = (int)lVar3;
  __src_00 = luaL_optlstring((lua_State *)l,3,"",(size_t *)&s);
  if (sep._4_4_ < 1) {
    lua_pushlstring((lua_State *)l,"",0);
  }
  else {
    if ((s + lsep < lsep) ||
       (auVar1._8_8_ = 0, auVar1._0_8_ = (long)sep._4_4_,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) <= s + lsep)) {
      iVar2 = luaL_error((lua_State *)l,"resulting string too large");
      return iVar2;
    }
    b.initb._8184_8_ = (long)sep._4_4_ * lsep + (long)(sep._4_4_ + -1) * (long)s;
    local_2070 = luaL_buffinitsize((lua_State *)l,(luaL_Buffer *)&p,b.initb._8184_8_);
    while (iVar2 = sep._4_4_ + -1, 1 < sep._4_4_) {
      memcpy(local_2070,__src,lsep);
      local_2070 = local_2070 + lsep;
      sep._4_4_ = iVar2;
      if (s != (char *)0x0) {
        memcpy(local_2070,__src_00,(size_t)s);
        local_2070 = s + (long)local_2070;
      }
    }
    memcpy(local_2070,__src,lsep);
    luaL_pushresultsize((luaL_Buffer *)&p,b.initb._8184_8_);
  }
  return 1;
}

Assistant:

static int str_rep (lua_State *L) {
  size_t l, lsep;
  const char *s = luaL_checklstring(L, 1, &l);
  int n = luaL_checkint(L, 2);
  const char *sep = luaL_optlstring(L, 3, "", &lsep);
  if (n <= 0) lua_pushliteral(L, "");
  else if (l + lsep < l || l + lsep >= MAXSIZE / n)  /* may overflow? */
    return luaL_error(L, "resulting string too large");
  else {
    size_t totallen = n * l + (n - 1) * lsep;
    luaL_Buffer b;
    char *p = luaL_buffinitsize(L, &b, totallen);
    while (n-- > 1) {  /* first n-1 copies (followed by separator) */
      memcpy(p, s, l * sizeof(char)); p += l;
      if (lsep > 0) {  /* avoid empty 'memcpy' (may be expensive) */
        memcpy(p, sep, lsep * sizeof(char)); p += lsep;
      }
    }
    memcpy(p, s, l * sizeof(char));  /* last copy (not followed by separator) */
    luaL_pushresultsize(&b, totallen);
  }
  return 1;
}